

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

Iterator * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::find
          (Iterator *__return_storage_ptr__,
          Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  longlong *plVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  self_type *psVar4;
  int iVar5;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar6;
  Iterator *it;
  longlong lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *unaff_R14;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar13;
  undefined8 in_XMM0_Qa;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  plVar1 = &(this->stats_).num_lookups;
  *plVar1 = *plVar1 + 1;
  pAVar6 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *
           )this->root_node_;
  pAVar13 = pAVar6;
  if ((pAVar6->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar5 = *key;
    auVar14._0_8_ = (double)iVar5;
    auVar14._8_8_ = in_XMM0_Qa;
    lVar7 = (this->stats_).num_node_lookups;
    auVar15._8_8_ = 0x7fffffffffffffff;
    auVar15._0_8_ = 0x7fffffffffffffff;
    do {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (pAVar6->super_AlexNode<int,_int>).model_.a_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (pAVar6->super_AlexNode<int,_int>).model_.b_;
      auVar2 = vfmadd213sd_fma(auVar17,auVar14,auVar2);
      dVar16 = auVar2._0_8_;
      uVar9 = *(int *)&pAVar6->allocator_ - 1;
      uVar8 = ~((int)dVar16 >> 0x1f) & (int)dVar16;
      if ((int)uVar8 <= (int)uVar9) {
        uVar9 = uVar8;
      }
      pAVar6 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                *)(&(pAVar6->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar9];
      bVar3 = (pAVar6->super_AlexNode<int,_int>).is_leaf_;
      if (bVar3 == true) {
        lVar7 = lVar7 + (pAVar6->super_AlexNode<int,_int>).level_;
        (this->stats_).num_node_lookups = lVar7;
        auVar17 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar16 + 0.5)));
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar16 - auVar17._0_8_;
        auVar2 = vandpd_avx(auVar18,auVar15);
        unaff_R14 = pAVar6;
        if (auVar2._0_8_ <= dVar16 * 2.220446049250313e-15) {
          if (auVar17._0_8_ <= dVar16) {
            pAVar13 = pAVar6->prev_leaf_;
            if (pAVar13 !=
                (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)0x0) {
              iVar10 = pAVar13->data_capacity_;
              uVar11 = (long)(iVar10 + -1);
              do {
                uVar12 = uVar11;
                if (iVar10 < 1) {
                  iVar10 = -0x80000000;
                  goto LAB_001425a2;
                }
                iVar10 = iVar10 + -1;
                uVar11 = uVar12 - 1;
              } while ((pAVar13->bitmap_[uVar12 >> 6 & 0x3ffffff] >> (uVar12 & 0x3f) & 1) == 0);
              iVar10 = pAVar13->key_slots_[uVar12];
LAB_001425a2:
              unaff_R14 = pAVar13;
              if (iVar10 < iVar5) {
                unaff_R14 = pAVar6;
              }
            }
          }
          else {
            psVar4 = pAVar6->next_leaf_;
            if (psVar4 != (self_type *)0x0) {
              iVar10 = 0x7fffffff;
              if (0 < psVar4->data_capacity_) {
                uVar11 = 0;
                do {
                  if ((psVar4->bitmap_[uVar11 >> 6 & 0x3ffffff] >> (uVar11 & 0x3f) & 1) != 0) {
                    iVar10 = psVar4->key_slots_[uVar11];
                    break;
                  }
                  uVar11 = uVar11 + 1;
                } while (psVar4->data_capacity_ != (int)uVar11);
              }
              unaff_R14 = psVar4;
              if (iVar5 < iVar10) {
                unaff_R14 = pAVar6;
              }
            }
          }
        }
      }
      pAVar13 = unaff_R14;
    } while (bVar3 == false);
  }
  iVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          find_key(pAVar13,key);
  if (iVar5 < 0) {
    __return_storage_ptr__->cur_leaf_ = (data_node_type *)0x0;
    __return_storage_ptr__->cur_idx_ = 0;
    __return_storage_ptr__->cur_bitmap_idx_ = 0;
    __return_storage_ptr__->cur_bitmap_data_ = 0;
  }
  else {
    __return_storage_ptr__->cur_leaf_ = pAVar13;
    __return_storage_ptr__->cur_idx_ = iVar5;
    __return_storage_ptr__->cur_bitmap_idx_ = 0;
    __return_storage_ptr__->cur_bitmap_data_ = 0;
    Iterator::initialize(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

typename self_type::Iterator find(const T& key) {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_key(key);
    if (idx < 0) {
      return end();
    } else {
      return Iterator(leaf, idx);
    }
  }